

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::io::ArrayInputStream::Skip(ArrayInputStream *this,int count)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  int local_1c;
  ArrayInputStream *pAStack_18;
  int count_local;
  ArrayInputStream *this_local;
  
  local_59 = 0;
  local_1c = count;
  pAStack_18 = this;
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x59);
    local_59 = 1;
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=(local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  this->last_returned_size_ = 0;
  bVar1 = local_1c <= this->size_ - this->position_;
  if (bVar1) {
    this->position_ = local_1c + this->position_;
  }
  else {
    this->position_ = this->size_;
  }
  return bVar1;
}

Assistant:

bool ArrayInputStream::Skip(int count) {
  GOOGLE_CHECK_GE(count, 0);
  last_returned_size_ = 0;   // Don't let caller back up.
  if (count > size_ - position_) {
    position_ = size_;
    return false;
  } else {
    position_ += count;
    return true;
  }
}